

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

uint32_t __thiscall cfd::core::AbstractTransaction::GetTotalSize(AbstractTransaction *this)

{
  wally_tx *tx;
  int iVar1;
  uint uVar2;
  CfdException *this_00;
  uint32_t flags;
  allocator local_45;
  int ret;
  size_t length;
  undefined1 local_38 [32];
  
  length = 0;
  tx = (wally_tx *)this->wally_tx_pointer_;
  iVar1 = (*this->_vptr_AbstractTransaction[7])();
  flags = 0;
  if ((char)iVar1 != '\0') {
    uVar2 = (*this->_vptr_AbstractTransaction[9])(this);
    flags = uVar2 & 1;
  }
  ret = wally_tx_get_length(tx,flags,&length);
  if (ret == 0) {
    return (uint32_t)length;
  }
  local_38._0_8_ = "cfdcore_transaction_common.cpp";
  local_38._8_4_ = 0x23c;
  local_38._16_8_ = "GetTotalSize";
  logger::warn<int&>((CfdSourceLocation *)local_38,"wally_tx_get_length NG[{}].",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"transaction size calc error.",&local_45);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t AbstractTransaction::GetTotalSize() const {
  size_t length = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  uint32_t flag = 0;
  if (HasWitness()) {
    flag = GetWallyFlag() & WALLY_TX_FLAG_USE_WITNESS;
  }
  int ret = wally_tx_get_length(tx_pointer, flag, &length);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_length NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "transaction size calc error.");
  }
  return static_cast<uint32_t>(length);
}